

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall
glslang::TParseVersions::checkDeprecated
          (TParseVersions *this,TSourceLoc *loc,int profileMask,int depVersion,char *featureDesc)

{
  TInfoSink *this_00;
  int iVar1;
  pool_allocator<char> local_100;
  TString local_f8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  if (((this->profile & profileMask) != EBadProfile) && (depVersion <= this->version)) {
    if (this->forwardCompatible == true) {
      (*this->_vptr_TParseVersions[0x2d])
                (this,loc,"deprecated, may be removed in future release",featureDesc,"",
                 this->_vptr_TParseVersions[0x2d]);
      return;
    }
    if ((this->messages & EShMsgSuppressWarnings) == EShMsgDefault) {
      this_00 = this->infoSink;
      iVar1 = depVersion;
      local_100.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_d0,featureDesc,&local_100);
      std::operator+(&local_a8,&local_d0," deprecated in version ");
      String_abi_cxx11_(&local_f8,(glslang *)(ulong)(uint)depVersion,10,iVar1);
      std::operator+(&local_80,&local_a8,&local_f8);
      std::operator+(&local_58,&local_80,"; may be removed in future release");
      TInfoSinkBase::message
                (&this_00->info,EPrefixWarning,local_58._M_dataplus._M_p,loc,
                 (bool)((byte)(this->messages >> 0x10) & 1),
                 (bool)((byte)(this->messages >> 0x11) & 1));
    }
  }
  return;
}

Assistant:

void TParseVersions::checkDeprecated(const TSourceLoc& loc, int profileMask, int depVersion, const char* featureDesc)
{
    if (profile & profileMask) {
        if (version >= depVersion) {
            if (forwardCompatible)
                error(loc, "deprecated, may be removed in future release", featureDesc, "");
            else if (! suppressWarnings())
                infoSink.info.message(EPrefixWarning, (TString(featureDesc) + " deprecated in version " +
                                                       String(depVersion) + "; may be removed in future release").c_str(), 
                                                       loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
        }
    }
}